

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O2

void __thiscall cmCTestP4::DiffParser::~DiffParser(DiffParser *this)

{
  ~DiffParser(this);
  operator_delete(this,0x140);
  return;
}

Assistant:

DiffParser(cmCTestP4* p4, const char* prefix)
    : P4(p4)
  {
    this->SetLog(&this->P4->Log, prefix);
    this->RegexDiff.compile("^==== (.*)#[0-9]+ - (.*)");
  }